

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_sid.cpp
# Opt level: O2

bool __thiscall
cppcms::sessions::session_sid::load
          (session_sid *this,session_interface *session,string *data,time_t *timeout)

{
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  time_t tVar4;
  string *__return_storage_ptr__;
  string tmp_data;
  string id;
  string local_60;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__ = &local_60;
  session_interface::get_session_cookie_abi_cxx11_(__return_storage_ptr__,session);
  bVar2 = valid_sid((session_sid *)__return_storage_ptr__,&local_60,&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  if (!bVar2) {
    bVar2 = false;
    goto LAB_0023aab2;
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  peVar1 = (this->storage_).
           super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar3 = (*peVar1->_vptr_session_storage[1])(peVar1,&local_40,timeout,data);
  if ((char)iVar3 == '\0') {
LAB_0023aaa2:
    bVar2 = false;
  }
  else {
    tVar4 = time((time_t *)0x0);
    bVar2 = true;
    if (*timeout < tVar4) {
      peVar1 = (this->storage_).
               super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      (*peVar1->_vptr_session_storage[2])(peVar1,&local_40);
      goto LAB_0023aaa2;
    }
  }
  std::__cxx11::string::~string((string *)&local_60);
LAB_0023aab2:
  std::__cxx11::string::~string((string *)&local_40);
  return bVar2;
}

Assistant:

bool session_sid::load(session_interface &session,std::string &data,time_t &timeout)
{
	std::string id;
	if(!valid_sid(session.get_session_cookie(),id))
		return false;
	std::string tmp_data;
	if(!storage_->load(id,timeout,data))
		return false;
	if(time(0) > timeout) {
		storage_->remove(id);
		return false;
	}
	return true;
}